

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  ulong uVar6;
  char *pcVar7;
  cmState *pcVar8;
  size_t __val;
  pair<std::_Rb_tree_const_iterator<cmTarget_*>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  char *local_398;
  allocator<char> local_369;
  undefined1 local_368 [8];
  string msg;
  string local_340;
  _Base_ptr local_320;
  undefined1 local_318;
  _Base_ptr local_310;
  undefined1 local_308;
  cmTarget *local_300;
  cmTarget *depTarget;
  string *depName;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraDeps;
  string local_2b8;
  undefined1 local_298 [8];
  string deps;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  mapped_type *local_210;
  string *filename;
  string *cfg_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  allocator<char> local_1c1;
  string local_1c0;
  mapped_type *local_1a0;
  string *dir;
  string *cfg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  string cbd;
  PolicyStatus CMP0071_status;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *folder;
  unsigned_long iVerb;
  allocator<char> local_71;
  string local_70;
  string local_50;
  cmGlobalGenerator *local_30;
  cmGlobalGenerator *globalGen;
  cmLocalGenerator *localGen;
  cmMakefile *makefile;
  cmQtAutoGenInitializer *this_local;
  
  makefile = (cmMakefile *)this;
  localGen = (cmLocalGenerator *)cmTarget::GetMakefile(this->Target->Target);
  globalGen = (cmGlobalGenerator *)cmGeneratorTarget::GetLocalGenerator(this->Target);
  local_30 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)globalGen);
  iVar4 = (*local_30->_vptr_cmGlobalGenerator[0x23])();
  this->MultiConfig = (bool)((byte)iVar4 & 1);
  cmMakefile::GetConfigurations(&local_50,(cmMakefile *)localGen,&this->ConfigsList,true);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->ConfigsList);
  if (bVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ConfigsList,&this->ConfigDefault);
  }
  pcVar2 = localGen;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CMAKE_AUTOGEN_VERBOSE",&local_71);
  psVar5 = cmMakefile::GetSafeDefinition((cmMakefile *)pcVar2,&local_70);
  std::__cxx11::string::operator=((string *)&this->Verbosity,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    folder = (char *)0x0;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar3 = cmSystemTools::StringToULong(pcVar7,(unsigned_long *)&folder);
    if (!bVar3) {
      bVar3 = cmSystemTools::IsOn(&this->Verbosity);
      if (bVar3) {
        local_398 = "1";
      }
      else {
        local_398 = "0";
      }
      std::__cxx11::string::operator=((string *)&this->Verbosity,local_398);
    }
  }
  pcVar8 = cmMakefile::GetState((cmMakefile *)localGen);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"AUTOMOC_TARGETS_FOLDER",&local_b9);
  pcVar7 = cmState::GetGlobalProperty(pcVar8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pcVar7;
  if (pcVar7 == (char *)0x0) {
    pcVar8 = cmMakefile::GetState((cmMakefile *)localGen);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"AUTOGEN_TARGETS_FOLDER",&local_e1);
    local_98 = cmState::GetGlobalProperty(pcVar8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  if (local_98 == (char *)0x0) {
    pcVar1 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&CMP0071_status,"FOLDER",
               (allocator<char> *)(cbd.field_2._M_local_buf + 0xf));
    local_98 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&CMP0071_status);
    std::__cxx11::string::~string((string *)&CMP0071_status);
    std::allocator<char>::~allocator((allocator<char> *)(cbd.field_2._M_local_buf + 0xf));
  }
  if (local_98 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->TargetsFolder,local_98);
  }
  cbd.field_2._8_4_ = cmMakefile::GetPolicyStatus((cmMakefile *)localGen,CMP0071,false);
  if (cbd.field_2._8_4_ != OLD) {
    if (cbd.field_2._8_4_ == WARN) {
      this->CMP0071Warn = true;
    }
    else if (cbd.field_2._8_4_ - NEW < 3) {
      this->CMP0071Accept = true;
    }
  }
  std::__cxx11::string::string((string *)&local_150);
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)localGen);
  cmsys::SystemTools::CollapseFullPath((string *)local_130,&local_150,psVar5);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)local_130);
  std::__cxx11::string::operator+=((string *)&this->Dir,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)&this->Dir,'/');
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::operator+=((string *)&this->Dir,(string *)psVar5);
  std::__cxx11::string::operator+=((string *)&this->Dir,"_autogen");
  std::__cxx11::string::operator+=((string *)&this->Dir,".dir");
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar1 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"AUTOGEN_BUILD_DIR",(allocator<char> *)((long)&__range2 + 7));
  pcVar7 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_170);
  std::__cxx11::string::operator=((string *)&(this->Dir).Build,pcVar7);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&(this->Dir).Build,(string *)local_130);
    std::__cxx11::string::operator+=((string *)&(this->Dir).Build,'/');
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::operator+=((string *)&(this->Dir).Build,(string *)psVar5);
    std::__cxx11::string::operator+=((string *)&(this->Dir).Build,"_autogen");
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Build);
  AddCleanFile(this,&(this->Dir).Build);
  std::__cxx11::string::operator=((string *)&(this->Dir).Work,(string *)local_130);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Work);
  std::__cxx11::string::operator=((string *)&(this->Dir).Include,(string *)&(this->Dir).Build);
  std::__cxx11::string::operator+=((string *)&(this->Dir).Include,"/include");
  if ((this->MultiConfig & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)&(this->Dir).Include,"_$<CONFIG>");
  }
  if ((this->MultiConfig & 1U) != 0) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ConfigsList);
    cfg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->ConfigsList);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cfg), bVar3) {
      dir = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
      local_1a0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->Dir).ConfigInclude,dir);
      std::__cxx11::string::operator=((string *)local_1a0,(string *)&(this->Dir).Build);
      std::__cxx11::string::operator+=((string *)local_1a0,"/include_");
      std::__cxx11::string::operator+=((string *)local_1a0,(string *)dir);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::string::~string((string *)local_130);
  bVar3 = MocOrUicEnabled(this);
  if (bVar3) {
    if ((((this->Moc).super_GenVarsT.Enabled & 1U) != 0) && (bVar3 = InitMoc(this), !bVar3)) {
      return false;
    }
    if ((((this->Uic).super_GenVarsT.Enabled & 1U) != 0) && (bVar3 = InitUic(this), !bVar3)) {
      return false;
    }
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)psVar5);
    std::__cxx11::string::operator+=((string *)&this->AutogenTarget,"_autogen");
    pcVar1 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"AUTOGEN_PARALLEL",&local_1c1);
    pcVar7 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_1c0);
    std::__cxx11::string::operator=((string *)&(this->AutogenTarget).Parallel,pcVar7);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    uVar6 = std::__cxx11::string::empty();
    if (((uVar6 & 1) != 0) ||
       (bVar3 = std::operator==(&(this->AutogenTarget).Parallel,"AUTO"), bVar3)) {
      __val = GetParallelCPUCount();
      std::__cxx11::to_string((string *)&__range3,__val);
      std::__cxx11::string::operator=((string *)&(this->AutogenTarget).Parallel,(string *)&__range3)
      ;
      std::__cxx11::string::~string((string *)&__range3);
    }
    std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)&this->Dir);
    std::__cxx11::string::operator+=((string *)&(this->AutogenTarget).InfoFile,"/AutogenInfo.cmake")
    ;
    std::__cxx11::string::operator=
              ((string *)&(this->AutogenTarget).SettingsFile,(string *)&this->Dir);
    std::__cxx11::string::operator+=
              ((string *)&(this->AutogenTarget).SettingsFile,"/AutogenOldSettings.txt");
    if ((this->MultiConfig & 1U) == 0) {
      AddCleanFile(this,&(this->AutogenTarget).SettingsFile);
    }
    else {
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->ConfigsList);
      cfg_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->ConfigsList);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&cfg_1), bVar3) {
        filename = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        local_210 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&(this->AutogenTarget).ConfigSettingsFile,filename);
        std::operator+(&local_250,"_",filename);
        cmQtAutoGen::AppendFilenameSuffix(&local_230,&(this->AutogenTarget).SettingsFile,&local_250)
        ;
        std::__cxx11::string::operator=((string *)local_210,(string *)&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        AddCleanFile(this,local_210);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    psVar5 = &(this->AutogenTarget).ParseCacheFile;
    std::__cxx11::string::operator=((string *)psVar5,(string *)&this->Dir);
    std::__cxx11::string::operator+=((string *)psVar5,"/ParseCache.txt");
    AddCleanFile(this,psVar5);
    pcVar1 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"AUTOGEN_ORIGIN_DEPENDS",
               (allocator<char> *)(deps.field_2._M_local_buf + 0xf));
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_270);
    (this->AutogenTarget).DependOrigin = bVar3;
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)(deps.field_2._M_local_buf + 0xf));
    pcVar1 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"AUTOGEN_TARGET_DEPENDS",
               (allocator<char> *)
               ((long)&extraDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar7 = cmGeneratorTarget::GetSafeProperty(pcVar1,&local_2b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,pcVar7,
               (allocator<char> *)
               ((long)&extraDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3_1);
      cmSystemTools::ExpandListArgument
                ((string *)local_298,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range3_1,false);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3_1);
      depName = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&depName), bVar3) {
        depTarget = (cmTarget *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3_1);
        local_300 = cmMakefile::FindTargetToUse((cmMakefile *)localGen,(string *)depTarget,false);
        if (local_300 == (cmTarget *)0x0) {
          pVar10 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(&(this->AutogenTarget).DependFiles,(value_type *)depTarget);
          local_320 = (_Base_ptr)pVar10.first._M_node;
          local_318 = pVar10.second;
        }
        else {
          pVar9 = std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::insert
                            (&(this->AutogenTarget).DependTargets,&local_300);
          local_310 = (_Base_ptr)pVar9.first._M_node;
          local_308 = pVar9.second;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3_1);
    }
    std::__cxx11::string::~string((string *)local_298);
    pcVar2 = localGen;
    if (((this->Moc).super_GenVarsT.Enabled & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"CMAKE_AUTOMOC_RELAXED_MODE",
                 (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      pcVar7 = cmMakefile::GetDefinition((cmMakefile *)pcVar2,&local_340);
      bVar3 = cmSystemTools::IsOn(pcVar7);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_368,
                   "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  "
                   ,&local_369);
        std::allocator<char>::~allocator(&local_369);
        std::__cxx11::string::operator+=
                  ((string *)local_368,"Consider disabling it and converting the target ");
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        std::__cxx11::string::operator+=((string *)local_368,(string *)psVar5);
        std::__cxx11::string::operator+=((string *)local_368," to regular mode.");
        cmMakefile::IssueMessage((cmMakefile *)localGen,AUTHOR_WARNING,(string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
      }
    }
  }
  if ((((this->Rcc).super_GenVarsT.Enabled & 1U) == 0) || (bVar3 = InitRcc(this), bVar3)) {
    bVar3 = MocOrUicEnabled(this);
    if ((bVar3) ||
       ((((this->Rcc).super_GenVarsT.Enabled & 1U) != 0 && ((this->MultiConfig & 1U) != 0)))) {
      cmGeneratorTarget::AddIncludeDirectory(this->Target,&(this->Dir).Include,true);
    }
    bVar3 = InitScanFiles(this);
    if (bVar3) {
      bVar3 = MocOrUicEnabled(this);
      if ((!bVar3) || (bVar3 = InitAutogenTarget(this), bVar3)) {
        if ((((this->Rcc).super_GenVarsT.Enabled & 1U) == 0) ||
           (bVar3 = InitRccTargets(this), bVar3)) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Configurations
  this->MultiConfig = globalGen->IsMultiConfig();
  this->ConfigDefault = makefile->GetConfigurations(this->ConfigsList);
  if (this->ConfigsList.empty()) {
    this->ConfigsList.push_back(this->ConfigDefault);
  }

  // Verbosity
  this->Verbosity = makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
  if (!this->Verbosity.empty()) {
    unsigned long iVerb = 0;
    if (!cmSystemTools::StringToULong(this->Verbosity.c_str(), &iVerb)) {
      // Non numeric verbosity
      this->Verbosity = cmSystemTools::IsOn(this->Verbosity) ? "1" : "0";
    }
  }

  // Targets FOLDER
  {
    const char* folder =
      makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (folder == nullptr) {
      folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (folder == nullptr) {
      folder = this->Target->GetProperty("FOLDER");
    }
    if (folder != nullptr) {
      this->TargetsFolder = folder;
    }
  }

  // Check status of policy CMP0071
  {
    cmPolicies::PolicyStatus const CMP0071_status =
      makefile->GetPolicyStatus(cmPolicies::CMP0071);
    switch (CMP0071_status) {
      case cmPolicies::WARN:
        this->CMP0071Warn = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // Ignore GENERATED file
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Process GENERATED file
        this->CMP0071Accept = true;
        break;
    }
  }

  // Common directories
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cbd;
    this->Dir.Info += "/CMakeFiles";
    this->Dir.Info += '/';
    this->Dir.Info += this->Target->GetName();
    this->Dir.Info += "_autogen";
    this->Dir.Info += ".dir";
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->Target->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build = cbd;
      this->Dir.Build += '/';
      this->Dir.Build += this->Target->GetName();
      this->Dir.Build += "_autogen";
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->Dir.Include = this->Dir.Build;
    this->Dir.Include += "/include";
    if (this->MultiConfig) {
      this->Dir.Include += "_$<CONFIG>";
    }
    // Per config include directories
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::string& dir = this->Dir.ConfigInclude[cfg];
        dir = this->Dir.Build;
        dir += "/include_";
        dir += cfg;
      }
    }
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name = this->Target->GetName();
    this->AutogenTarget.Name += "_autogen";

    // Autogen target parallel processing
    this->AutogenTarget.Parallel =
      this->Target->GetSafeProperty("AUTOGEN_PARALLEL");
    if (this->AutogenTarget.Parallel.empty() ||
        (this->AutogenTarget.Parallel == "AUTO")) {
      // Autodetect number of CPUs
      this->AutogenTarget.Parallel = std::to_string(GetParallelCPUCount());
    }

    // Autogen target info and settings files
    {
      this->AutogenTarget.InfoFile = this->Dir.Info;
      this->AutogenTarget.InfoFile += "/AutogenInfo.cmake";

      this->AutogenTarget.SettingsFile = this->Dir.Info;
      this->AutogenTarget.SettingsFile += "/AutogenOldSettings.txt";

      if (this->MultiConfig) {
        for (std::string const& cfg : this->ConfigsList) {
          std::string& filename = this->AutogenTarget.ConfigSettingsFile[cfg];
          filename =
            AppendFilenameSuffix(this->AutogenTarget.SettingsFile, "_" + cfg);
          this->AddCleanFile(filename);
        }
      } else {
        this->AddCleanFile(this->AutogenTarget.SettingsFile);
      }

      this->AutogenTarget.ParseCacheFile = this->Dir.Info;
      this->AutogenTarget.ParseCacheFile += "/ParseCache.txt";
      this->AddCleanFile(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->Target->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const deps =
        this->Target->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        std::vector<std::string> extraDeps;
        cmSystemTools::ExpandListArgument(deps, extraDeps);
        for (std::string const& depName : extraDeps) {
          // Allow target and file dependencies
          auto* depTarget = makefile->FindTargetToUse(depName);
          if (depTarget != nullptr) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    // CMAKE_AUTOMOC_RELAXED_MODE deprecation warning
    if (this->Moc.Enabled) {
      if (cmSystemTools::IsOn(
            makefile->GetDefinition("CMAKE_AUTOMOC_RELAXED_MODE"))) {
        std::string msg = "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                          "deprecated an will be removed in the future.  ";
        msg += "Consider disabling it and converting the target ";
        msg += this->Target->GetName();
        msg += " to regular mode.";
        makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->Target->AddIncludeDirectory(this->Dir.Include, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}